

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PIC.hpp
# Opt level: O3

void __thiscall PCCompatible::PIC::write<0>(PIC *this,uint8_t value)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000031,value);
  if ((value & 0x10) != 0) {
    (this->config_).word = 0;
    (this->config_).has_fourth_word = (bool)(value & 1);
    if ((bool)(value & 1) == false) {
      this->auto_eoi_ = false;
    }
    this->single_pic_ = (bool)((byte)((uVar3 & 0xffffffff) >> 1) & 1);
    this->four_byte_vectors_ = (bool)((byte)((uVar3 & 0xffffffff) >> 2) & 1);
    this->level_triggered_ = (bool)(value >> 3 & 1);
    return;
  }
  if ((value & 8) != 0) {
    return;
  }
  uVar2 = uVar3 >> 5 & 0x7ffffff;
  iVar1 = (int)uVar2;
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      return;
    }
    if (iVar1 != 3) {
      printf("PIC: TODO EOI type %d\n",uVar2);
      return;
    }
    if (((uint)uVar3 & 3) != this->eoi_target_) {
      return;
    }
  }
  this->awaiting_eoi_ = false;
  return;
}

Assistant:

void write(uint8_t value) {
			if(address) {
				if(config_.word >= 0) {
					switch(config_.word) {
						case 0:
							vector_base_ = value;
						break;
						case 1:
							if(config_.has_fourth_word) {
								// TODO:
								//
								//	(1) slave mask if this is a master;
								//	(2) master interrupt attachment if this is a slave.
							}
							[[fallthrough]];
						case 2:
							auto_eoi_ = value & 2;
						break;
					}

					++config_.word;
					if(config_.word == (config_.has_fourth_word ? 3 : 2)) {
						config_.word = -1;
					}
				} else {
					mask_ = value;
				}
			} else {
				if(value & 0x10) {
					//
					// Initialisation Command Word 1.
					//

					config_.word = 0;
					config_.has_fourth_word = value & 1;

					if(!config_.has_fourth_word) {
						auto_eoi_ = false;
					}

					single_pic_ = value & 2;
					four_byte_vectors_ = value & 4;
					level_triggered_ = value & 8;
				} else if(value & 0x08) {
					//
					// Operation Control Word 3.
					//

					// b6: 1 => use b5; 0 => ignore.
					// b5: 1 => set special mask; 0 => clear.
					// b2: 1 => poll command issued; 0 => not.
					// b1: 1 => use b0; 0 => ignore.
					// b0: 1 => read IRR on next read; 0 => read ISR.
				} else {
					//
					// Operation Control Word 2.
					//

					// b7, b6, b5:	EOI type.
					// b2, b1, b0:	interrupt level to acknowledge.
					switch(value >> 5) {
						default:
							printf("PIC: TODO EOI type %d\n", value >> 5);
						case 0b010:	// No-op.
						break;

						case 0b001:	// Non-specific EOI.
							awaiting_eoi_ = false;
						break;

						case 0b011: {	// Specific EOI.
							if((value & 3) == eoi_target_) {
								awaiting_eoi_ = false;
							}
						} break;

						// TODO:
						//	0b000 = rotate in auto EOI mode (clear)
						//	0b100 = rotate in auto EOI mode (set)
						//	0b101 = rotate on nonspecific EOI command
						//	0b110 = set primary command
						//	0b111 = rotate on specific EOI command
					}
				}
			}
		}